

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

QItemDelegate * __thiscall
QItemDelegate::decoration(QItemDelegate *this,QStyleOptionViewItem *option,QVariant *variant)

{
  int iVar1;
  QVariant *in_RCX;
  long in_FS_OFFSET;
  double dVar2;
  QColor QVar3;
  anon_union_24_3_e3d07ef4_for_data local_48;
  
  local_48._16_8_ = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = ::QVariant::typeId(in_RCX);
  if (iVar1 == 0x1003) {
    if ((decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap == '\0') &&
       (iVar1 = __cxa_guard_acquire(&decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap
                                   ), iVar1 != 0)) {
      QPixmap::QPixmap((QPixmap *)decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap,
                       (QSize *)((long)&variant[2].d.data + 0x10));
      __cxa_atexit(QPixmap::~QPixmap,decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap
                   ,0x7fe000);
      __cxa_guard_release(&decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap);
    }
    QVar3 = qvariant_cast<QColor>(in_RCX);
    local_48.shared = (PrivateShared *)QVar3._0_8_;
    local_48._8_4_ = QVar3.ct._4_4_;
    local_48._12_2_ = QVar3.ct._8_2_;
    QPixmap::fill((QColor *)decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap);
    QPixmap::QPixmap((QPixmap *)this,
                     (QPixmap *)decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap);
  }
  else {
    if (iVar1 != 0x1005) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_48._16_8_) {
        qvariant_cast<QPixmap>((QVariant *)this);
        return this;
      }
      goto LAB_005032af;
    }
    if (*(long *)&variant[3].d.field_0x18 == 0) {
      dVar2 = (double)QGuiApplication::devicePixelRatio();
    }
    else {
      dVar2 = (double)QPaintDevice::devicePixelRatio();
    }
    qvariant_cast<QIcon>((QVariant *)&local_48);
    QIcon::pixmap((QSize *)this,dVar2,(Mode)&local_48,(int)variant + 0x50);
    QIcon::~QIcon((QIcon *)&local_48.shared);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48._16_8_) {
    return this;
  }
LAB_005032af:
  __stack_chk_fail();
}

Assistant:

QPixmap QItemDelegate::decoration(const QStyleOptionViewItem &option, const QVariant &variant) const
{
    Q_D(const QItemDelegate);
    switch (variant.userType()) {
    case QMetaType::QIcon: {
        QIcon::Mode mode = d->iconMode(option.state);
        QIcon::State state = d->iconState(option.state);
        const auto dpr = QStyleHelper::getDpr(option.widget);
        return qvariant_cast<QIcon>(variant).pixmap(option.decorationSize, dpr, mode, state); }
    case QMetaType::QColor: {
        static QPixmap pixmap(option.decorationSize);
        pixmap.fill(qvariant_cast<QColor>(variant));
        return pixmap; }
    default:
        break;
    }

    return qvariant_cast<QPixmap>(variant);
}